

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * slang::ast::builtins::PlaTask::badRange(ASTContext *context,Expression *arg)

{
  SourceRange sourceRange;
  Compilation *this;
  Type *pTVar1;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  DiagCode unaff_retaddr;
  Type *in_stack_00000018;
  Diagnostic *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe8;
  
  sourceRange.endLoc = in_RDI;
  sourceRange.startLoc = in_RSI;
  ASTContext::addDiag((ASTContext *)CONCAT44(0x1e000b,in_stack_ffffffffffffffe8),unaff_retaddr,
                      sourceRange);
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9a2d0a);
  ast::operator<<(in_stack_00000020,in_stack_00000018);
  this = ASTContext::getCompilation((ASTContext *)0x9a2d21);
  pTVar1 = Compilation::getErrorType(this);
  return pTVar1;
}

Assistant:

static const Type& badRange(const ASTContext& context, const Expression& arg) {
        context.addDiag(diag::PlaRangeInAscendingOrder, arg.sourceRange) << *arg.type;
        return context.getCompilation().getErrorType();
    }